

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  if ((pIVar1->IsEnabled & 1U) != 0) {
    pIVar1->CannotSkipItemsQueue = '\x01';
    table->AutoFitSingleColumn = (ImGuiTableColumnIdx)column_n;
  }
  return;
}

Assistant:

void ImGui::TableSetColumnWidthAutoSingle(ImGuiTable* table, int column_n)
{
    // Single auto width uses auto-fit
    ImGuiTableColumn* column = &table->Columns[column_n];
    if (!column->IsEnabled)
        return;
    column->CannotSkipItemsQueue = (1 << 0);
    table->AutoFitSingleColumn = (ImGuiTableColumnIdx)column_n;
}